

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::AddToEvalMap
          (ScriptContext *this,FastEvalMapString *key,BOOL isIndirect,ScriptFunction *pfuncScript)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *this_00;
  undefined4 *puVar3;
  FunctionBody *this_01;
  Utf8SourceInfo *this_02;
  Utf8SourceInfo *utf8SourceInfo;
  ScriptFunction *pfuncScript_local;
  BOOL isIndirect_local;
  FastEvalMapString *key_local;
  ScriptContext *this_local;
  
  this_00 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)pfuncScript);
  bVar2 = FunctionInfo::IsGenerator(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xb4e,"(!pfuncScript->GetFunctionInfo()->IsGenerator())",
                                "!pfuncScript->GetFunctionInfo()->IsGenerator()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  this_02 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_01);
  bVar2 = IsScriptContextInDebugMode(this);
  if (((bVar2) && (bVar2 = Utf8SourceInfo::GetIsLibraryCode(this_02), !bVar2)) &&
     (bVar2 = Utf8SourceInfo::IsInDebugMode(this_02), !bVar2)) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  bVar2 = IsTTDRecordOrReplayModeEnabled(this);
  if (!bVar2) {
    AddToEvalMapHelper(this,key,isIndirect,pfuncScript);
  }
  return;
}

Assistant:

void ScriptContext::AddToEvalMap(FastEvalMapString & key, BOOL isIndirect, ScriptFunction *pfuncScript)
    {
        Assert(!pfuncScript->GetFunctionInfo()->IsGenerator());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        Js::Utf8SourceInfo* utf8SourceInfo = pfuncScript->GetFunctionBody()->GetUtf8SourceInfo();
        if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // Identifying if any non library function escaped for not being in debug mode.
            Throw::FatalInternalError();
        }
#endif

#if ENABLE_TTD
        if(!this->IsTTDRecordOrReplayModeEnabled())
        {
            this->AddToEvalMapHelper(key, isIndirect, pfuncScript);
        }
#else
        this->AddToEvalMapHelper(key, isIndirect, pfuncScript);
#endif
    }